

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readArray(Reader *this,Token *param_1)

{
  bool bVar1;
  int iVar2;
  _Elt_pointer ppVVar3;
  byte *pbVar4;
  int index;
  Token endArray;
  Token token;
  ValueHolder local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Token local_48;
  
  Value::Value((Value *)local_68,arrayValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::operator=(ppVVar3[-1],(Value *)local_68);
  Value::~Value((Value *)local_68);
  pbVar4 = (byte *)this->current_;
  while (((pbVar4 != (byte *)this->end_ && ((ulong)*pbVar4 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
    pbVar4 = pbVar4 + 1;
    this->current_ = (Location)pbVar4;
  }
  if (*this->current_ == ']') {
    readToken(this,(Token *)local_68);
  }
  else {
    index = 0;
    do {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar3 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_68[0].map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],index);
      std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
                ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                 (Value **)&local_68[0].map_);
      bVar1 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (bVar1) {
        do {
          readToken(this,&local_48);
        } while (local_48.type_ == tokenComment);
        if (local_48.type_ == tokenArrayEnd) {
          iVar2 = 2;
        }
        else {
          if (local_48.type_ != tokenArraySeparator) {
            local_68[0].string_ = (char *)&local_58;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_68,"Missing \',\' or \']\' in array declaration","");
            addError(this,(string *)local_68,&local_48,(Location)0x0);
            recoverFromError(this,tokenArrayEnd);
            if (local_68[0] != &local_58) {
              operator_delete(local_68[0].string_,local_58._M_allocated_capacity + 1);
            }
            goto LAB_0018eab3;
          }
          iVar2 = 0;
        }
      }
      else {
        recoverFromError(this,tokenArrayEnd);
LAB_0018eab3:
        iVar2 = 1;
      }
      index = index + 1;
    } while (iVar2 == 0);
    if (iVar2 != 2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool 
Reader::readArray( Token &/*tokenStart*/ )
{
   currentValue() = Value( arrayValue );
   skipSpaces();
   if ( *current_ == ']' ) // empty array
   {
      Token endArray;
      readToken( endArray );
      return true;
   }
   int index = 0;
   for (;;)
   {
      Value &value = currentValue()[ index++ ];
      nodes_.push( &value );
      bool ok = readValue();
      nodes_.pop();
      if ( !ok ) // error already set
         return recoverFromError( tokenArrayEnd );

      Token token;
      // Accept Comment after last item in the array.
      ok = readToken( token );
      while ( token.type_ == tokenComment  &&  ok )
      {
         ok = readToken( token );
      }
      bool badTokenType = ( token.type_ != tokenArraySeparator  &&
                            token.type_ != tokenArrayEnd );
      if ( !ok  ||  badTokenType )
      {
         return addErrorAndRecover( "Missing ',' or ']' in array declaration", 
                                    token, 
                                    tokenArrayEnd );
      }
      if ( token.type_ == tokenArrayEnd )
         break;
   }
   return true;
}